

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * re2::StringPrintf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  uint uVar1;
  char in_AL;
  uint uVar2;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong __maxlen;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  va_list backup_ap;
  char space [1024];
  undefined8 local_508;
  void **ppvStack_500;
  undefined1 *local_4f8;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined4 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  char local_438 [1032];
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Da;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_508 = 0x3000000010;
  ppvStack_500 = &ap[0].overflow_arg_area;
  local_4f8 = local_4e8;
  local_4d8 = in_RDX;
  local_4d0 = in_RCX;
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  uVar2 = vsnprintf(local_438,0x400,format,&local_508);
  if (uVar2 < 0x400) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_438);
  }
  else {
    __maxlen = 0x400;
    while( true ) {
      uVar1 = uVar2 + 1;
      if ((int)uVar2 < 0) {
        uVar1 = (int)__maxlen * 2;
      }
      __maxlen = (ulong)uVar1;
      __s = (char *)operator_new__(__maxlen);
      local_508 = 0x3000000010;
      ppvStack_500 = &ap[0].overflow_arg_area;
      local_4f8 = local_4e8;
      uVar2 = vsnprintf(__s,__maxlen,format,&local_508);
      if ((int)uVar2 < (int)uVar1 && -1 < (int)uVar2) break;
      operator_delete__(__s);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)__s);
    operator_delete__(__s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringPrintf(const char* format, ...) {
  va_list ap;
  va_start(ap, format);
  std::string result;
  StringAppendV(&result, format, ap);
  va_end(ap);
  return result;
}